

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.h
# Opt level: O0

bool __thiscall spdlog::sinks::sink::should_log(sink *this,level_enum msg_level)

{
  level_enum msg_level_local;
  sink *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(int *)(this + 8) <= (int)msg_level;
}

Assistant:

bool should_log(level::level_enum msg_level) const
    {
        return msg_level >= level_.load(std::memory_order_relaxed);
    }